

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall
leveldb::_Test_RecoverDuringMemtableCompaction::_Run(_Test_RecoverDuringMemtableCompaction *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  DB *pDVar3;
  Options options;
  undefined1 local_2a9;
  string local_2a8;
  Status local_288;
  string local_280;
  string local_260;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  Tester local_230;
  Options local_90;
  
  while( true ) {
    DBTest::CurrentOptions(&local_90,&this->super_DBTest);
    local_90.env = (Env *)(this->super_DBTest).env_;
    local_90.write_buffer_size = 1000000;
    DBTest::Reopen(&this->super_DBTest,&local_90);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f0;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    paVar1 = &local_280.field_2;
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"foo","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"v1","");
    pDVar3 = (this->super_DBTest).db_;
    local_2a9 = 0;
    local_260._M_dataplus._M_p = local_280._M_dataplus._M_p;
    local_260._M_string_length = local_280._M_string_length;
    local_240 = local_2a8._M_dataplus._M_p._0_4_;
    uStack_23c = local_2a8._M_dataplus._M_p._4_4_;
    uStack_238 = (undefined4)local_2a8._M_string_length;
    uStack_234 = local_2a8._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_288,pDVar3,&local_2a9,&local_260,&local_240);
    test::Tester::IsOk(&local_230,&local_288);
    if (local_288.state_ != (char *)0x0) {
      operator_delete__(local_288.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f1;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"big1","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,-0x80);
    pDVar3 = (this->super_DBTest).db_;
    local_2a9 = 0;
    local_260._M_dataplus._M_p = local_280._M_dataplus._M_p;
    local_260._M_string_length = local_280._M_string_length;
    local_240 = local_2a8._M_dataplus._M_p._0_4_;
    uStack_23c = local_2a8._M_dataplus._M_p._4_4_;
    uStack_238 = (undefined4)local_2a8._M_string_length;
    uStack_234 = local_2a8._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_288,pDVar3,&local_2a9,&local_260,&local_240);
    test::Tester::IsOk(&local_230,&local_288);
    if (local_288.state_ != (char *)0x0) {
      operator_delete__(local_288.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f2;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"big2","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,-0x18);
    pDVar3 = (this->super_DBTest).db_;
    local_2a9 = 0;
    local_260._M_dataplus._M_p = local_280._M_dataplus._M_p;
    local_260._M_string_length = local_280._M_string_length;
    local_240 = local_2a8._M_dataplus._M_p._0_4_;
    uStack_23c = local_2a8._M_dataplus._M_p._4_4_;
    uStack_238 = (undefined4)local_2a8._M_string_length;
    uStack_234 = local_2a8._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_288,pDVar3,&local_2a9,&local_260,&local_240);
    test::Tester::IsOk(&local_230,&local_288);
    if (local_288.state_ != (char *)0x0) {
      operator_delete__(local_288.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f3;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"bar","");
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"v2","");
    pDVar3 = (this->super_DBTest).db_;
    local_2a9 = 0;
    local_260._M_dataplus._M_p = local_280._M_dataplus._M_p;
    local_260._M_string_length = local_280._M_string_length;
    local_240 = local_2a8._M_dataplus._M_p._0_4_;
    uStack_23c = local_2a8._M_dataplus._M_p._4_4_;
    uStack_238 = (undefined4)local_2a8._M_string_length;
    uStack_234 = local_2a8._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_288,pDVar3,&local_2a9,&local_260,&local_240);
    test::Tester::IsOk(&local_230,&local_288);
    if (local_288.state_ != (char *)0x0) {
      operator_delete__(local_288.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    DBTest::Reopen(&this->super_DBTest,&local_90);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f6;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"foo","");
    DBTest::Get(&local_280,&this->super_DBTest,&local_2a8,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_230,(char (*) [3])"v1",&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f7;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"bar","");
    DBTest::Get(&local_280,&this->super_DBTest,&local_2a8,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>(&local_230,(char (*) [3])"v2",&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f8;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_280,-0x80);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"big1","");
    DBTest::Get(&local_2a8,&this->super_DBTest,&local_260,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_280,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    local_230.ok_ = true;
    local_230.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_230.line_ = 0x3f9;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_230.ss_);
    local_280._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_280,-0x18);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"big2","");
    DBTest::Get(&local_2a8,&this->super_DBTest,&local_260,(Snapshot *)0x0);
    test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_230,&local_280,&local_2a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    test::Tester::~Tester(&local_230);
    iVar2 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar2 + 1;
    if (2 < iVar2) break;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, RecoverDuringMemtableCompaction) {
  do {
    Options options = CurrentOptions();
    options.env = env_;
    options.write_buffer_size = 1000000;
    Reopen(&options);

    // Trigger a long memtable compaction and reopen the database during it
    ASSERT_OK(Put("foo", "v1"));                         // Goes to 1st log file
    ASSERT_OK(Put("big1", std::string(10000000, 'x')));  // Fills memtable
    ASSERT_OK(Put("big2", std::string(1000, 'y')));      // Triggers compaction
    ASSERT_OK(Put("bar", "v2"));                         // Goes to new log file

    Reopen(&options);
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_EQ("v2", Get("bar"));
    ASSERT_EQ(std::string(10000000, 'x'), Get("big1"));
    ASSERT_EQ(std::string(1000, 'y'), Get("big2"));
  } while (ChangeOptions());
}